

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

IterationResult __thiscall
helics::FederateState::enterInitializingMode(FederateState *this,IterationRequest request)

{
  bool bVar1;
  FederateStates FVar2;
  undefined1 in_SIL;
  FederateState *in_RDI;
  IterationResult ret;
  MessageProcessingResult ret_1;
  FederateState *in_stack_00000030;
  FederateState *in_stack_00000188;
  undefined1 in_stack_ffffffffffffffdf;
  undefined5 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffed;
  undefined1 in_stack_ffffffffffffffee;
  IterationResult local_1;
  
  bVar1 = try_lock(in_RDI);
  if (bVar1) {
    local_1 = processQueue(in_stack_00000188);
    unlock(in_RDI);
    std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffdf);
    if (local_1 == NEXT_STEP) {
      (in_RDI->time_granted).internalTimeCode = -1000000000000000;
      (in_RDI->allowed_send_time).internalTimeCode = -1000000000000000;
    }
  }
  else {
    sleeplock(in_stack_00000030);
    FVar2 = getState((FederateState *)0x4c179d);
    if (FVar2 == CREATED) {
      unlock(in_RDI);
      local_1 = enterInitializingMode
                          ((FederateState *)
                           CONCAT17(in_SIL,CONCAT16(in_stack_ffffffffffffffee,
                                                    CONCAT15(in_stack_ffffffffffffffed,
                                                             in_stack_ffffffffffffffe8))),
                           (IterationRequest)((ulong)in_RDI >> 0x38));
    }
    else {
      if (FVar2 == ERRORED) {
        local_1 = ERROR_RESULT;
      }
      else if (FVar2 == FINISHED) {
        local_1 = HALTED;
      }
      else {
        local_1 = NEXT_STEP;
      }
      unlock(in_RDI);
    }
  }
  return local_1;
}

Assistant:

IterationResult FederateState::enterInitializingMode(IterationRequest request)
{
    if (try_lock()) {  // only enter this loop once per federate
        auto ret = processQueue();
        unlock();
        initIterating = false;
        switch (ret) {
            case MessageProcessingResult::NEXT_STEP:
                time_granted = initialTime;
                allowed_send_time = initialTime;
                break;
            case MessageProcessingResult::ITERATING:
            default:
                break;
        }
        return static_cast<IterationResult>(ret);
    }
    // this function can handle try_lock fail gracefully
    sleeplock();
    IterationResult ret;
    switch (getState()) {
        case FederateStates::ERRORED:
            ret = IterationResult::ERROR_RESULT;
            break;
        case FederateStates::FINISHED:
            ret = IterationResult::HALTED;
            break;
        case FederateStates::CREATED:
            unlock();
            return enterInitializingMode(request);
        default:  // everything >= INITIALIZING
            ret = IterationResult::NEXT_STEP;
            break;
    }
    unlock();
    return ret;
}